

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintServiceStub
          (Generator *this,ServiceDescriptor *descriptor)

{
  Printer *this_00;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  io::Printer::Print(this->printer_,"class $class_name$_Stub($class_name$):\n","class_name",
                     *(string **)descriptor);
  io::Printer::Indent(this->printer_);
  this_00 = this->printer_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"DESCRIPTOR",&local_59);
  ModuleLevelServiceDescriptorName_abi_cxx11_(&local_58,this,descriptor);
  io::Printer::Print(this_00,
                     "__metaclass__ = service_reflection.GeneratedServiceStubType\n$descriptor_key$ = $descriptor_name$\n"
                     ,"descriptor_key",&local_38,"descriptor_name",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  io::Printer::Outdent(this->printer_);
  return;
}

Assistant:

void Generator::PrintServiceStub(const ServiceDescriptor& descriptor) const {
  // Print the service stub.
  printer_->Print("class $class_name$_Stub($class_name$):\n",
                  "class_name", descriptor.name());
  printer_->Indent();
  printer_->Print(
      "__metaclass__ = service_reflection.GeneratedServiceStubType\n"
      "$descriptor_key$ = $descriptor_name$\n",
      "descriptor_key", kDescriptorKey,
      "descriptor_name", ModuleLevelServiceDescriptorName(descriptor));
  printer_->Outdent();
}